

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evolution-test.c++
# Opt level: O2

ChangeInfo *
capnp::compiler::anon_unknown_0::structAddField
          (ChangeInfo *__return_storage_ptr__,Builder decl,uint *nextOrdinal,bool scopeHasUnion)

{
  ArrayPtr<const_char> AVar1;
  uint uVar2;
  uint *params_1;
  ulong uVar3;
  uint index;
  uint i;
  ArrayPtr<const_char> *pAVar4;
  Reader value;
  Reader value_00;
  StringPtr description;
  uint ordinal;
  ConstFunction<void_(capnp::compiler::Expression::Builder)> makeValue;
  BuilderFor<capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>_> oldNested;
  Builder local_1f8;
  Reader local_1c8;
  Builder newNested;
  Builder field;
  Builder local_148;
  Orphan<capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>_> oldNestedOrphan;
  Builder local_f8;
  Builder fieldDecl;
  StructBuilder local_a8;
  Builder local_80;
  ListBuilder local_58;
  
  local_f8._builder.dataSize = decl._builder.dataSize;
  local_f8._builder.pointerCount = decl._builder.pointerCount;
  local_f8._builder._38_2_ = decl._builder._38_2_;
  local_f8._builder.data = decl._builder.data;
  local_f8._builder.pointers = decl._builder.pointers;
  local_f8._builder.segment = decl._builder.segment;
  local_f8._builder.capTable = decl._builder.capTable;
  Declaration::Builder::disownNestedDecls
            ((Orphan<capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>_> *)
             &oldNestedOrphan.builder,&local_f8);
  _::OrphanGetImpl<capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>,_(capnp::Kind)6>::apply
            (&oldNested,&oldNestedOrphan.builder);
  Declaration::Builder::initNestedDecls(&newNested,&local_f8,oldNested.builder.elementCount + 1);
  uVar2 = rand();
  uVar3 = (ulong)uVar2 % (ulong)(oldNested.builder.elementCount + 1);
  for (uVar2 = 0; index = (uint)uVar3, uVar2 < index; uVar2 = uVar2 + 1) {
    _::ListBuilder::getStructElement(&local_a8,&oldNested.builder,uVar2);
    _::StructBuilder::asReader(&local_a8);
    List<capnp::compiler::Declaration,_(capnp::Kind)3>::Builder::setWithCaveats
              (&newNested,uVar2,&local_1c8);
  }
  while( true ) {
    uVar2 = (ElementCount)uVar3 + 1;
    if (newNested.builder.elementCount <= uVar2) break;
    _::ListBuilder::getStructElement(&local_a8,&oldNested.builder,(ElementCount)uVar3);
    _::StructBuilder::asReader(&local_a8);
    List<capnp::compiler::Declaration,_(capnp::Kind)3>::Builder::setWithCaveats
              (&newNested,uVar2,&local_1c8);
    uVar3 = (ulong)uVar2;
  }
  _::ListBuilder::getStructElement(&fieldDecl._builder,&newNested.builder,index);
  _::OrphanBuilder::~OrphanBuilder(&oldNestedOrphan.builder);
  ordinal = *nextOrdinal;
  params_1 = (uint *)(ulong)(ordinal + 1);
  *nextOrdinal = ordinal + 1;
  Declaration::Builder::initName((Builder *)&local_1c8,&fieldDecl);
  kj::str<char_const(&)[2],unsigned_int&>
            ((String *)&oldNested,(kj *)0x1ec6ec,(char (*) [2])&ordinal,params_1);
  if (oldNested.builder.capTable == (CapTableBuilder *)0x0) {
    oldNested.builder.segment = (SegmentBuilder *)0x1ebdf1;
  }
  value.super_StringPtr.content.size_ =
       (long)&((oldNested.builder.capTable)->super_CapTableReader)._vptr_CapTableReader +
       (ulong)(oldNested.builder.capTable == (CapTableBuilder *)0x0);
  value.super_StringPtr.content.ptr = (char *)oldNested.builder.segment;
  LocatedText::Builder::setValue((Builder *)&local_1c8,value);
  kj::Array<char>::~Array((Array<char> *)&oldNested);
  oldNested.builder.structDataSize = fieldDecl._builder.dataSize;
  oldNested.builder.structPointerCount = fieldDecl._builder.pointerCount;
  oldNested.builder.elementSize = fieldDecl._builder._38_1_;
  oldNested.builder._39_1_ = fieldDecl._builder._39_1_;
  oldNested.builder.ptr = (byte *)fieldDecl._builder.data;
  oldNested.builder._24_8_ = fieldDecl._builder.pointers;
  oldNested.builder.segment = fieldDecl._builder.segment;
  oldNested.builder.capTable = fieldDecl._builder.capTable;
  Declaration::Id::Builder::initOrdinal((Builder *)&local_1c8,(Builder *)&oldNested);
  *(ulong *)local_1c8._reader.data = (ulong)ordinal;
  Declaration::Builder::initField(&field,&fieldDecl);
  Declaration::Field::Builder::initType(&local_80,&field);
  local_1f8._builder.segment = local_80._builder.segment;
  local_1f8._builder.capTable = local_80._builder.capTable;
  local_1f8._builder.data = local_80._builder.data;
  local_1f8._builder.pointers = local_80._builder.pointers;
  local_1f8._builder.dataSize = local_80._builder.dataSize;
  local_1f8._builder.pointerCount = local_80._builder.pointerCount;
  local_1f8._builder._38_2_ = local_80._builder._38_2_;
  uVar2 = rand();
  pAVar4 = (ArrayPtr<const_char> *)
           ((long)&(anonymous_namespace)::TYPE_OPTIONS + (ulong)((uVar2 & 7) << 5));
  uVar2 = rand();
  if ((uVar2 & 3) == 0) {
    Expression::Builder::initApplication((Builder *)&newNested,&local_1f8);
    Expression::Application::Builder::initFunction((Builder *)&local_a8,(Builder *)&newNested);
    oldNested.builder.structDataSize = local_a8.dataSize;
    oldNested.builder.structPointerCount = local_a8.pointerCount;
    oldNested.builder.elementSize = local_a8._38_1_;
    oldNested.builder._39_1_ = local_a8._39_1_;
    oldNested.builder.ptr = (byte *)local_a8.data;
    oldNested.builder._24_8_ = local_a8.pointers;
    oldNested.builder.segment = local_a8.segment;
    oldNested.builder.capTable = local_a8.capTable;
    Expression::Builder::initRelativeName((Builder *)&local_1c8,(Builder *)&oldNested);
    value_00.super_StringPtr.content.size_ = 5;
    value_00.super_StringPtr.content.ptr = "List";
    LocatedText::Builder::setValue((Builder *)&local_1c8,value_00);
    Expression::Application::Builder::initParams((Builder *)&local_58,(Builder *)&newNested,1);
    _::ListBuilder::getStructElement((StructBuilder *)&oldNestedOrphan,&local_58,0);
    Expression::Param::Builder::initValue((Builder *)&local_f8,(Builder *)&oldNestedOrphan);
    AVar1 = *pAVar4;
    oldNested.builder.structDataSize = local_f8._builder.dataSize;
    oldNested.builder.structPointerCount = local_f8._builder.pointerCount;
    oldNested.builder.elementSize = local_f8._builder._38_1_;
    oldNested.builder._39_1_ = local_f8._builder._39_1_;
    oldNested.builder.ptr = (byte *)local_f8._builder.data;
    oldNested.builder._24_8_ = local_f8._builder.pointers;
    oldNested.builder.segment = local_f8._builder.segment;
    oldNested.builder.capTable = local_f8._builder.capTable;
    Expression::Builder::initRelativeName((Builder *)&local_1c8,(Builder *)&oldNested);
    LocatedText::Builder::setValue((Builder *)&local_1c8,(Reader)AVar1);
    makeValue.impl.ptr = (Iface *)operator_new(0x10);
    (makeValue.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___0021b940;
    makeValue.impl.ptr[1]._vptr_Iface = (_func_int **)pAVar4;
    makeValue.impl.disposer =
         (Disposer *)
         &kj::_::
          HeapDisposer<kj::ConstFunction<void(capnp::compiler::Expression::Builder)>::Impl<capnp::compiler::(anonymous_namespace)::randomizeType(capnp::compiler::Expression::Builder)::$_0>>
          ::instance;
  }
  else {
    oldNested.builder.structDataSize = local_1f8._builder.dataSize;
    oldNested.builder.structPointerCount = local_1f8._builder.pointerCount;
    oldNested.builder.elementSize = local_1f8._builder._38_1_;
    oldNested.builder._39_1_ = local_1f8._builder._39_1_;
    oldNested.builder.ptr = (byte *)local_1f8._builder.data;
    oldNested.builder._24_8_ = local_1f8._builder.pointers;
    oldNested.builder.segment = local_1f8._builder.segment;
    oldNested.builder.capTable = local_1f8._builder.capTable;
    AVar1 = *pAVar4;
    Expression::Builder::initRelativeName((Builder *)&local_1c8,(Builder *)&oldNested);
    LocatedText::Builder::setValue((Builder *)&local_1c8,(Reader)AVar1);
    kj::ConstFunction<void_(capnp::compiler::Expression::Builder)>::reference(&makeValue);
  }
  uVar2 = rand();
  if ((uVar2 & 3) == 0) {
    local_1c8._reader.dataSize = field._builder.dataSize;
    local_1c8._reader.pointerCount = field._builder.pointerCount;
    local_1c8._reader._38_2_ = field._builder._38_2_;
    local_1c8._reader.data = field._builder.data;
    local_1c8._reader.pointers = field._builder.pointers;
    local_1c8._reader.segment = &(field._builder.segment)->super_SegmentReader;
    local_1c8._reader.capTable = &(field._builder.capTable)->super_CapTableReader;
    Declaration::Field::DefaultValue::Builder::initValue(&local_148,(Builder *)&local_1c8);
    (**(makeValue.impl.ptr)->_vptr_Iface)();
  }
  else {
    *(undefined2 *)((long)field._builder.data + 0xc) = 0;
  }
  description.content.size_ = 0xb;
  description.content.ptr = "Add field.";
  ChangeInfo::ChangeInfo(__return_storage_ptr__,COMPATIBLE,description);
  kj::Own<kj::ConstFunction<void_(capnp::compiler::Expression::Builder)>::Iface>::dispose
            (&makeValue.impl);
  return __return_storage_ptr__;
}

Assistant:

static ChangeInfo structAddField(Declaration::Builder decl, uint& nextOrdinal, bool scopeHasUnion) {
  auto fieldDecl = addNested(decl);

  uint ordinal = nextOrdinal++;

  fieldDecl.initName().setValue(kj::str("f", ordinal));
  fieldDecl.getId().initOrdinal().setValue(ordinal);

  auto field = fieldDecl.initField();

  auto makeValue = randomizeType(field.initType());
  if (rand() % 4 == 0) {
    makeValue(field.getDefaultValue().initValue());
  } else {
    field.getDefaultValue().setNone();
  }
  return { COMPATIBLE, "Add field." };
}